

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

void __thiscall chrono::ChContactContainerSMC::ComputeContactForces(ChContactContainerSMC *this)

{
  unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
  *this_00;
  
  this_00 = &this->contact_forces;
  std::
  _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>>
            (&this->super_ChContactContainer,&this->contactlist_3_3,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
            (&this->super_ChContactContainer,&this->contactlist_6_3,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->super_ChContactContainer,&this->contactlist_6_6,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
            (&this->super_ChContactContainer,&this->contactlist_333_3,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>>
            (&this->super_ChContactContainer,&this->contactlist_333_6,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->super_ChContactContainer,&this->contactlist_333_333,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>>
            (&this->super_ChContactContainer,&this->contactlist_666_3,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>>
            (&this->super_ChContactContainer,&this->contactlist_666_6,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->super_ChContactContainer,&this->contactlist_666_333,this_00);
  ChContactContainer::
  SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
            (&this->super_ChContactContainer,&this->contactlist_666_666,this_00);
  return;
}

Assistant:

void ChContactContainerSMC::ComputeContactForces() {
    contact_forces.clear();
    SumAllContactForces(contactlist_3_3, contact_forces);
    SumAllContactForces(contactlist_6_3, contact_forces);
    SumAllContactForces(contactlist_6_6, contact_forces);
    SumAllContactForces(contactlist_333_3, contact_forces);
    SumAllContactForces(contactlist_333_6, contact_forces);
    SumAllContactForces(contactlist_333_333, contact_forces);
    SumAllContactForces(contactlist_666_3, contact_forces);
    SumAllContactForces(contactlist_666_6, contact_forces);
    SumAllContactForces(contactlist_666_333, contact_forces);
    SumAllContactForces(contactlist_666_666, contact_forces);
}